

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# results_cache.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reclaim_last(results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *this,nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *out)

{
  node_base *pnVar1;
  node_base *pnVar2;
  node_base *pnVar3;
  
  pnVar3 = (out->
           super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._sentry._prev;
  if (pnVar3[8]._prev != (node_base *)&pnVar3[7]._next) {
    reclaim_all(this,(nested_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pnVar3[7]._next);
    pnVar3 = (out->
             super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._sentry._prev;
  }
  pnVar1 = pnVar3->_prev;
  pnVar2 = pnVar3->_next;
  pnVar1->_next = pnVar2;
  pnVar2->_prev = pnVar1;
  pnVar3->_next = (node_base *)this;
  pnVar1 = (this->cache_).
           super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._sentry._prev;
  pnVar3->_prev = pnVar1;
  pnVar1->_next = pnVar3;
  (this->cache_).
  super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._sentry._prev = pnVar3;
  return;
}

Assistant:

void reclaim_last(nested_results<BidiIter> &out)
        {
            BOOST_ASSERT(!out.empty());
            // first, reclaim any nested results
            nested_results<BidiIter> &nested = access::get_nested_results(out.back());
            if(!nested.empty())
            {
                this->reclaim_all(nested);
            }
            // then, reclaim the last match_results
            this->cache_.splice(this->cache_.end(), out, --out.end());
        }